

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_init.c
# Opt level: O0

int engine_unlocked_finish(ENGINE *e,int unlock_for_handlers)

{
  int iVar1;
  int in_ESI;
  char *in_RDI;
  int to_return;
  int iVar2;
  int in_stack_fffffffffffffffc;
  
  iVar2 = 1;
  *(int *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) + -1;
  if ((*(int *)(in_RDI + 0xa0) == 0) && (*(long *)(in_RDI + 0x68) != 0)) {
    if (in_ESI != 0) {
      CRYPTO_THREAD_unlock((CRYPTO_RWLOCK *)CONCAT44(in_ESI,1));
    }
    iVar2 = (**(code **)(in_RDI + 0x68))(in_RDI);
    if ((in_ESI != 0) &&
       (iVar1 = CRYPTO_THREAD_write_lock((CRYPTO_RWLOCK *)CONCAT44(in_ESI,iVar2)), iVar1 == 0)) {
      return 0;
    }
    if (iVar2 == 0) {
      return 0;
    }
  }
  iVar1 = engine_free_util((ENGINE *)CONCAT44(in_ESI,iVar2),0);
  if (iVar1 == 0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(unlock_for_handlers,to_return),in_stack_fffffffffffffffc,in_RDI);
    ERR_set_error(0x26,0x6a,(char *)0x0);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int engine_unlocked_finish(ENGINE *e, int unlock_for_handlers)
{
    int to_return = 1;

    /*
     * Reduce the functional reference count here so if it's the terminating
     * case, we can release the lock safely and call the finish() handler
     * without risk of a race. We get a race if we leave the count until
     * after and something else is calling "finish" at the same time -
     * there's a chance that both threads will together take the count from 2
     * to 0 without either calling finish().
     */
    e->funct_ref--;
    ENGINE_REF_PRINT(e, 1, -1);
    if ((e->funct_ref == 0) && e->finish) {
        if (unlock_for_handlers)
            CRYPTO_THREAD_unlock(global_engine_lock);
        to_return = e->finish(e);
        if (unlock_for_handlers)
            if (!CRYPTO_THREAD_write_lock(global_engine_lock))
                return 0;
        if (!to_return)
            return 0;
    }
    REF_ASSERT_ISNT(e->funct_ref < 0);
    /* Release the structural reference too */
    if (!engine_free_util(e, 0)) {
        ERR_raise(ERR_LIB_ENGINE, ENGINE_R_FINISH_FAILED);
        return 0;
    }
    return to_return;
}